

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O2

bool __thiscall
vkt::image::anon_unknown_2::BinaryAtomicEndResultInstance::verifyResult
          (BinaryAtomicEndResultInstance *this,Allocation *outputBufferAllocation)

{
  AtomicOperation op;
  int iVar1;
  uint uVar2;
  int iVar3;
  deInt32 dVar4;
  int iVar5;
  int z;
  int iVar6;
  int iVar7;
  deInt32 i;
  int iVar8;
  uint uVar9;
  int y;
  bool bVar10;
  IVec3 gid;
  IVec3 extendedGridSize;
  UVec3 gridSize;
  ConstPixelBufferAccess resultBuffer;
  
  getShaderGridSize((image *)&gridSize,(this->super_BinaryAtomicInstanceBase).m_imageType,
                    &(this->super_BinaryAtomicInstanceBase).m_imageSize);
  extendedGridSize.m_data[0] = gridSize.m_data[0] * 5;
  extendedGridSize.m_data[1] = gridSize.m_data[1];
  extendedGridSize.m_data[2] = gridSize.m_data[2];
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&resultBuffer,&(this->super_BinaryAtomicInstanceBase).m_format,gridSize.m_data[0],
             gridSize.m_data[1],gridSize.m_data[2],outputBufferAllocation->m_hostPtr);
  for (iVar7 = 0; iVar3 = resultBuffer.m_size.m_data[2], iVar7 < resultBuffer.m_size.m_data[2];
      iVar7 = iVar7 + 1) {
    for (z = 0; z < resultBuffer.m_size.m_data[1]; z = z + 1) {
      for (y = 0; y < resultBuffer.m_size.m_data[0]; y = y + 1) {
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)&gid,(int)&resultBuffer,y,z);
        uVar2 = gridSize.m_data[0];
        iVar1 = gid.m_data[0];
        op = (this->super_BinaryAtomicInstanceBase).m_operation;
        if ((ulong)op < 6) {
          iVar5 = *(int *)(&DAT_009d43d0 + (ulong)op * 4);
          iVar6 = 5;
          iVar8 = y;
          while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
            gid.m_data[0] = iVar8;
            gid.m_data[1] = z;
            gid.m_data[2] = iVar7;
            dVar4 = getAtomicFuncArgument(op,&gid,&extendedGridSize);
            iVar5 = computeBinaryAtomicOperationResult(op,iVar5,dVar4);
            iVar8 = iVar8 + uVar2;
          }
          if (iVar1 != iVar5) goto LAB_006d15d2;
        }
        else if (op == ATOMIC_OPERATION_EXCHANGE) {
          uVar9 = 0;
          bVar10 = false;
          iVar5 = y;
          while ((uVar9 < 5 && (!bVar10))) {
            gid.m_data[0] = iVar5;
            gid.m_data[1] = z;
            gid.m_data[2] = iVar7;
            dVar4 = getAtomicFuncArgument(ATOMIC_OPERATION_EXCHANGE,&gid,&extendedGridSize);
            uVar9 = uVar9 + 1;
            iVar5 = iVar5 + uVar2;
            bVar10 = iVar1 == dVar4;
          }
          if (!bVar10) goto LAB_006d15d2;
        }
      }
    }
  }
LAB_006d15d2:
  return iVar3 <= iVar7;
}

Assistant:

bool BinaryAtomicEndResultInstance::verifyResult (Allocation& outputBufferAllocation) const
{
	const UVec3	gridSize			= getShaderGridSize(m_imageType, m_imageSize);
	const IVec3 extendedGridSize	= IVec3(NUM_INVOCATIONS_PER_PIXEL*gridSize.x(), gridSize.y(), gridSize.z());

	tcu::ConstPixelBufferAccess resultBuffer(m_format, gridSize.x(), gridSize.y(), gridSize.z(), outputBufferAllocation.getHostPtr());

	for (deInt32 z = 0; z < resultBuffer.getDepth();  z++)
	for (deInt32 y = 0; y < resultBuffer.getHeight(); y++)
	for (deInt32 x = 0; x < resultBuffer.getWidth();  x++)
	{
		deInt32 resultValue = resultBuffer.getPixelInt(x, y, z).x();

		if (isOrderIndependentAtomicOperation(m_operation))
		{
			deInt32 reference = getOperationInitialValue(m_operation);

			for (deInt32 i = 0; i < static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL); i++)
			{
				const IVec3 gid(x + i*gridSize.x(), y, z);
				reference = computeBinaryAtomicOperationResult(m_operation, reference, getAtomicFuncArgument(m_operation, gid, extendedGridSize));
			}

			if (resultValue != reference)
				return false;
		}
		else if (m_operation == ATOMIC_OPERATION_EXCHANGE)
		{
			// Check if the end result equals one of the atomic args.
			bool matchFound = false;

			for (deInt32 i = 0; i < static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL) && !matchFound; i++)
			{
				const IVec3 gid(x + i*gridSize.x(), y, z);
				matchFound = (resultValue == getAtomicFuncArgument(m_operation, gid, extendedGridSize));
			}

			if (!matchFound)
				return false;
		}
		else
			DE_ASSERT(false);
	}
	return true;
}